

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O2

void __thiscall SQFunctionProto::Release(SQFunctionProto *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  SQInteger nl;
  long lVar8;
  
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < this->_nliterals; lVar8 = lVar8 + 1) {
    SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)((long)&(this->_literals->super_SQObject)._type + lVar7));
    lVar7 = lVar7 + 0x10;
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < this->_nparameters; lVar8 = lVar8 + 1) {
    SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)((long)&(this->_parameters->super_SQObject)._type + lVar7));
    lVar7 = lVar7 + 0x10;
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < this->_nfunctions; lVar8 = lVar8 + 1) {
    SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)((long)&(this->_functions->super_SQObject)._type + lVar7));
    lVar7 = lVar7 + 0x10;
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar8 < this->_noutervalues; lVar8 = lVar8 + 1) {
    SQOuterVar::~SQOuterVar((SQOuterVar *)((long)&this->_outervalues->_type + lVar7));
    lVar7 = lVar7 + 0x28;
  }
  lVar7 = 0;
  for (lVar8 = 0; lVar1 = this->_nlocalvarinfos, lVar8 < lVar1; lVar8 = lVar8 + 1) {
    SQObjectPtr::~SQObjectPtr
              ((SQObjectPtr *)((long)&(this->_localvarinfos->_name).super_SQObject._type + lVar7));
    lVar7 = lVar7 + 0x28;
  }
  lVar7 = this->_nparameters;
  lVar8 = this->_ndefaultparams;
  lVar2 = this->_nliterals;
  lVar3 = this->_nfunctions;
  lVar4 = this->_nlineinfos;
  lVar5 = this->_ninstructions;
  lVar6 = this->_noutervalues;
  (**(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)(this);
  sq_vm_free(this,(lVar7 + lVar2 + lVar3 + lVar4) * 0x10 +
                  (lVar1 + lVar6) * 0x28 + (lVar8 + lVar5) * 8 + 0xe0);
  return;
}

Assistant:

void Release(){
        _DESTRUCT_VECTOR(SQObjectPtr,_nliterals,_literals);
        _DESTRUCT_VECTOR(SQObjectPtr,_nparameters,_parameters);
        _DESTRUCT_VECTOR(SQObjectPtr,_nfunctions,_functions);
        _DESTRUCT_VECTOR(SQOuterVar,_noutervalues,_outervalues);
        //_DESTRUCT_VECTOR(SQLineInfo,_nlineinfos,_lineinfos); //not required are 2 integers
        _DESTRUCT_VECTOR(SQLocalVarInfo,_nlocalvarinfos,_localvarinfos);
        SQInteger size = _FUNC_SIZE(_ninstructions,_nliterals,_nparameters,_nfunctions,_noutervalues,_nlineinfos,_nlocalvarinfos,_ndefaultparams);
        this->~SQFunctionProto();
        sq_vm_free(this,size);
    }